

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O2

OutPt * __thiscall
ClipperLib::Clipper::AddLocalMinPoly(Clipper *this,TEdge *e1,TEdge *e2,IntPoint *Pt)

{
  double dVar1;
  bool bVar2;
  OutPt *op1;
  TEdge *pTVar3;
  cInt cVar4;
  cInt cVar5;
  OutPt *op2;
  TEdge *edge;
  IntPoint pt1;
  IntPoint pt3;
  
  dVar1 = e2->Dx;
  if (((dVar1 == -1e+40) && (!NAN(dVar1))) || (dVar1 < e1->Dx)) {
    op1 = AddOutPt(this,e1,Pt);
    e2->OutIdx = e1->OutIdx;
    e1->Side = esLeft;
    e2->Side = esRight;
    edge = e1->PrevInAEL;
    pTVar3 = e2;
    if (edge != e2) goto LAB_0027c02a;
  }
  else {
    op1 = AddOutPt(this,e2,Pt);
    e1->OutIdx = e2->OutIdx;
    e1->Side = esRight;
    e2->Side = esLeft;
    edge = e2->PrevInAEL;
    bVar2 = edge != e1;
    pTVar3 = e1;
    e1 = e2;
    if (bVar2) goto LAB_0027c02a;
  }
  edge = pTVar3->PrevInAEL;
LAB_0027c02a:
  if (((edge != (TEdge *)0x0) && (-1 < edge->OutIdx)) &&
     ((cVar4 = Pt->Y, (edge->Top).Y < cVar4 && ((e1->Top).Y < cVar4)))) {
    cVar4 = TopX(edge,cVar4);
    cVar5 = TopX(e1,Pt->Y);
    if (((cVar4 == cVar5) && (e1->WindDelta != 0)) &&
       ((edge->WindDelta != 0 &&
        (pt1.Y = Pt->Y, pt1.X = cVar4, pt3.Y = Pt->Y, pt3.X = cVar4,
        bVar2 = SlopesEqual(pt1,edge->Top,pt3,e1->Top,
                            (bool)(this->_vptr_Clipper[-3] + 8)
                                  [(long)&(this->m_GhostJoins).
                                          super__Vector_base<ClipperLib::Join_*,_std::allocator<ClipperLib::Join_*>_>
                                  ]), bVar2)))) {
      op2 = AddOutPt(this,edge,Pt);
      AddJoin(this,op1,op2,e1->Top);
    }
  }
  return op1;
}

Assistant:

OutPt* Clipper::AddLocalMinPoly(TEdge *e1, TEdge *e2, const IntPoint &Pt)
{
  OutPt* result;
  TEdge *e, *prevE;
  if (IsHorizontal(*e2) || ( e1->Dx > e2->Dx ))
  {
    result = AddOutPt(e1, Pt);
    e2->OutIdx = e1->OutIdx;
    e1->Side = esLeft;
    e2->Side = esRight;
    e = e1;
    if (e->PrevInAEL == e2)
      prevE = e2->PrevInAEL; 
    else
      prevE = e->PrevInAEL;
  } else
  {
    result = AddOutPt(e2, Pt);
    e1->OutIdx = e2->OutIdx;
    e1->Side = esRight;
    e2->Side = esLeft;
    e = e2;
    if (e->PrevInAEL == e1)
        prevE = e1->PrevInAEL;
    else
        prevE = e->PrevInAEL;
  }

  if (prevE && prevE->OutIdx >= 0 && prevE->Top.Y < Pt.Y && e->Top.Y < Pt.Y) 
  {
    cInt xPrev = TopX(*prevE, Pt.Y);
    cInt xE = TopX(*e, Pt.Y);
    if (xPrev == xE && (e->WindDelta != 0) && (prevE->WindDelta != 0) &&
      SlopesEqual(IntPoint(xPrev, Pt.Y), prevE->Top, IntPoint(xE, Pt.Y), e->Top, m_UseFullRange))
    {
      OutPt* outPt = AddOutPt(prevE, Pt);
      AddJoin(result, outPt, e->Top);
    }
  }
  return result;
}